

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::vector<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>>,std::vector<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>>>
          (String *__return_storage_ptr__,detail *this,
          vector<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>
          *lhs,char *op,
          vector<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>
          *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  String::String(&local_40,"{?}");
  String::String(&local_58,(char *)lhs);
  String::operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  String::operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }